

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultContact.h
# Opt level: O0

void __thiscall
TgBot::InlineQueryResultContact::InlineQueryResultContact(InlineQueryResultContact *this)

{
  InlineQueryResultContact *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultContact_0051b0f0;
  std::__cxx11::string::string((string *)&this->phoneNumber);
  std::__cxx11::string::string((string *)&this->firstName);
  std::__cxx11::string::string((string *)&this->lastName);
  std::__cxx11::string::string((string *)&this->vcard);
  std::__cxx11::string::string((string *)&this->thumbUrl);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  this->thumbHeight = 0;
  this->thumbWidth = 0;
  return;
}

Assistant:

InlineQueryResultContact() {
        this->type = TYPE;
        this->thumbHeight = 0;
        this->thumbWidth = 0;
    }